

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  int i;
  int x;
  int n;
  map_bst<int,_int,_std::less<int>_> m;
  int local_50;
  int local_4c;
  map_bst<int,_int,_std::less<int>_> local_48;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105158) = 0;
  local_48.mRoot = (node *)0x0;
  local_48.mSize = 0;
  std::istream::operator>>((istream *)&std::cin,&local_4c);
  poVar3 = std::operator<<((ostream *)&std::cout,"Shallowest = ");
  iVar1 = CP::map_bst<int,_int,_std::less<int>_>::shallowest_leaf(&local_48);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::endl<char,std::char_traits<char>>(poVar3);
  for (iVar1 = 0; iVar1 < local_4c; iVar1 = iVar1 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_50);
    iVar2 = local_50;
    piVar4 = CP::map_bst<int,_int,_std::less<int>_>::operator[](&local_48,&local_50);
    *piVar4 = iVar2;
    poVar3 = std::operator<<((ostream *)&std::cout,"Shallowest = ");
    iVar2 = CP::map_bst<int,_int,_std::less<int>_>::shallowest_leaf(&local_48);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  CP::map_bst<int,_int,_std::less<int>_>::~map_bst(&local_48);
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(NULL);

  CP::map_bst<int,int> m;
  int n;
  std::cin >> n;
  std::cout << "Shallowest = " << m.shallowest_leaf() << std::endl;
  for (int i = 0;i < n;i++) {
    int x;
    std::cin >> x;
    m[x] = x;
    std::cout << "Shallowest = " << m.shallowest_leaf() << std::endl;
  }




}